

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O3

size_t OpenMD::CaseInsensitiveFind(string *str1,string *str2)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first2;
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  size_t sVar3;
  
  _Var2._M_current = (str1->_M_dataplus)._M_p;
  __first2._M_current = (str2->_M_dataplus)._M_p;
  _Var2 = std::
          __search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(char,char)>>
                    (_Var2,_Var2._M_current + str1->_M_string_length,__first2,
                     __first2._M_current + str2->_M_string_length,
                     (_Iter_comp_iter<bool_(*)(char,_char)>)0x228232);
  pcVar1 = (str1->_M_dataplus)._M_p;
  sVar3 = 0xffffffffffffffff;
  if (_Var2._M_current != pcVar1 + str1->_M_string_length) {
    sVar3 = (long)_Var2._M_current - (long)pcVar1;
  }
  return sVar3;
}

Assistant:

size_t CaseInsensitiveFind(const std::string& str1, const std::string& str2) {
    std::string::const_iterator pos =
        std::search(str1.begin(), str1.end(), str2.begin(), str2.end(),
                    CaseInsensitiveEquals);
    if (pos == str1.end())
      return std::string::npos;
    else
      return pos - str1.begin();
  }